

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadAsciiFile(COBImporter *this,Scene *out,StreamReaderLE *stream)

{
  bool bVar1;
  Scene *pSVar2;
  LineSplitter *pLVar3;
  LineSplitter splitter;
  _Map_pointer local_48;
  size_t sStack_40;
  
  local_48 = (_Map_pointer)0x0;
  sStack_40 = 0xffffffff00000000;
  LineSplitter::LineSplitter(&splitter,stream,true,true);
  while (*(int *)&(splitter.mStream)->end != *(int *)&(splitter.mStream)->current) {
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"PolH ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadPolH_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"BitM ");
    if (bVar1) {
      pSVar2 = (Scene *)&stack0xffffffffffffffb8;
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadBitM_Ascii(this,pSVar2,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Mat1 ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadMat1_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Grou ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadGrou_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Lght ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadLght_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Came ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadCame_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Bone ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadBone_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Chan ");
    if (bVar1) {
      pSVar2 = (Scene *)&stack0xffffffffffffffb8;
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadChan_Ascii(this,pSVar2,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    pLVar3 = &splitter;
    bVar1 = LineSplitter::match_start(&splitter,"Unit ");
    if (bVar1) {
      ReadChunkInfo_Ascii((COBImporter *)pLVar3,(ChunkInfo *)&stack0xffffffffffffffb8,&splitter);
      ReadUnit_Ascii(this,out,&splitter,(ChunkInfo *)&stack0xffffffffffffffb8);
    }
    bVar1 = LineSplitter::match_start(&splitter,"END ");
    if (bVar1) break;
    LineSplitter::operator++(&splitter);
  }
  std::__cxx11::string::~string((string *)&splitter.mCur);
  return;
}

Assistant:

void COBImporter::ReadAsciiFile(Scene& out, StreamReaderLE* stream)
{
    ChunkInfo ci;
    for(LineSplitter splitter(*stream);splitter;++splitter) {

        // add all chunks to be recognized here. /else ../ omitted intentionally.
        if (splitter.match_start("PolH ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadPolH_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("BitM ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBitM_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Mat1 ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadMat1_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Grou ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadGrou_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Lght ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadLght_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Came ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadCame_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Bone ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadBone_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Chan ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadChan_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("Unit ")) {
            ReadChunkInfo_Ascii(ci,splitter);
            ReadUnit_Ascii(out,splitter,ci);
        }
        if (splitter.match_start("END ")) {
            // we don't need this, but I guess there is a reason this
            // chunk has been implemented into COB for.
            return;
        }
    }
}